

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O0

bool P_Thing_Move(int tid,AActor *source,int mapspot,bool fog)

{
  AActor *this;
  DVector3 local_60;
  undefined1 local_48 [8];
  FActorIterator iterator2;
  FActorIterator iterator1;
  AActor *target;
  bool fog_local;
  AActor *pAStack_18;
  int mapspot_local;
  AActor *source_local;
  int tid_local;
  
  pAStack_18 = source;
  if (tid != 0) {
    FActorIterator::FActorIterator((FActorIterator *)&iterator2.id,tid);
    pAStack_18 = FActorIterator::Next((FActorIterator *)&iterator2.id);
  }
  FActorIterator::FActorIterator((FActorIterator *)local_48,mapspot);
  this = FActorIterator::Next((FActorIterator *)local_48);
  if ((pAStack_18 == (AActor *)0x0) || (this == (AActor *)0x0)) {
    source_local._7_1_ = false;
  }
  else {
    AActor::Pos(&local_60,this);
    source_local._7_1_ = P_MoveThing(pAStack_18,&local_60,fog);
  }
  return source_local._7_1_;
}

Assistant:

bool P_Thing_Move (int tid, AActor *source, int mapspot, bool fog)
{
	AActor *target;

	if (tid != 0)
	{
		FActorIterator iterator1(tid);
		source = iterator1.Next();
	}
	FActorIterator iterator2 (mapspot);
	target = iterator2.Next ();

	if (source != NULL && target != NULL)
	{
		return P_MoveThing(source, target->Pos(), fog);
	}
	return false;
}